

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test<unsigned_short>::Body
          (iu_TypedPrintToTest_x_iutest_x_Print_Test<unsigned_short> *this)

{
  unsigned_short *v;
  TypeParam_conflict5 d;
  TypeParam_conflict5 c;
  TypeParam_conflict5 a;
  undefined2 local_24e;
  unsigned_short local_24c [2];
  iuCodeMessage local_248;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  iuStreamMessage local_198;
  
  local_24c[1] = 0;
  local_24c[0] = 0;
  local_24e = 0;
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<unsigned_short>(&local_1b8,local_24c + 1);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_1b8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3db,"Succeeded.\n");
  local_248._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1b8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<unsigned_short>(&local_1d8,local_24c + 1);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_1d8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3dc,"Succeeded.\n");
  local_248._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1d8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<unsigned_short>(&local_1f8,local_24c);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_1f8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3dd,"Succeeded.\n");
  local_248._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1f8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<unsigned_short_volatile>(&local_218,(iutest *)&local_24e,v);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_218);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3de,"Succeeded.\n");
  local_248._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_218);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedPrintToTest, Print)
{
    TypeParam a = 0;
    TypeParam& b = a;
    const TypeParam c = a;
    const volatile TypeParam d = a;

    IUTEST_SUCCEED() << ::iutest::PrintToString(a);
    IUTEST_SUCCEED() << ::iutest::PrintToString(b);
    IUTEST_SUCCEED() << ::iutest::PrintToString(c);
    IUTEST_SUCCEED() << ::iutest::PrintToString(d);
}